

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void a_ensure_(void *v,int delta,int sz)

{
  undefined8 local_30;
  void *na;
  int nmax;
  int omax;
  a_void_ptr *a;
  int sz_local;
  int delta_local;
  void *v_local;
  
  na._4_4_ = *(int *)((long)v + 4);
  if (na._4_4_ < 0) {
    na._4_4_ = -na._4_4_;
  }
  if (na._4_4_ < *v + delta) {
    na._0_4_ = *v + delta;
    if (SBORROW4((int)na,na._4_4_ * 2) != (int)na + na._4_4_ * -2 < 0) {
      na._0_4_ = na._4_4_ << 1;
    }
    if (*(int *)((long)v + 4) < 1) {
      local_30 = malloc((long)((int)na * sz));
      memcpy(local_30,*(void **)((long)v + 8),(long)(na._4_4_ * sz));
    }
    else {
      local_30 = realloc(*(void **)((long)v + 8),(long)((int)na * sz));
    }
    memset((void *)((long)local_30 + (long)(na._4_4_ * sz)),0,(long)(((int)na - na._4_4_) * sz));
    *(void **)((long)v + 8) = local_30;
    *(int *)((long)v + 4) = (int)na;
  }
  return;
}

Assistant:

void a_ensure_ (void *v, int delta, int sz) {
	typedef A_TYPE (void *) a_void_ptr;
	a_void_ptr *a = (a_void_ptr *) v;
	int omax = a->h_.max_;
	if (omax < 0) {
		omax = -omax;
	}
	if (a->h_.len_ + delta > omax) {
		int nmax = a->h_.len_ + delta;
		void *na;
		if (nmax < omax * 2) {
			nmax = omax * 2;
		}
		if (a->h_.max_ <= 0) {
			na = malloc (nmax * sz);
			memcpy (na, a->a_, omax*sz);
		} else {
			na = realloc (a->a_, nmax*sz);
		}
		memset (omax *sz + (char *)na, 0, (nmax - omax) * sz);
		a->a_ = (void **) na;
		a->h_.max_ = nmax;
	}
}